

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_cmpm(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 src;
  TCGv_i32 dest;
  
  pTVar1 = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00d7df10 + (insn >> 4 & 0xc));
  src = gen_ea_mode(env,s,3,insn & 7,opsize,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  dest = gen_ea_mode(env,s,3,insn >> 9 & 7,opsize,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                     (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  gen_update_cc_cmp(s,dest,src,opsize);
  return;
}

Assistant:

DISAS_INSN(cmpm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize = insn_opsize(insn);
    TCGv src, dst;

    /* Post-increment load (mode 3) from Ay.  */
    src = gen_ea_mode(env, s, 3, REG(insn, 0), opsize,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADS, IS_USER(s));
    /* Post-increment load (mode 3) from Ax.  */
    dst = gen_ea_mode(env, s, 3, REG(insn, 9), opsize,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADS, IS_USER(s));

    gen_update_cc_cmp(s, dst, src, opsize);
}